

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpInit_Lagrange(void *arkode_mem,ARKInterp I,realtype tnew)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  if (arkode_mem == (void *)0x0) {
    return -0x15;
  }
  piVar4 = (int *)I->content;
  if (piVar4[1] < *piVar4) {
    if (*(void **)(piVar4 + 4) != (void *)0x0) {
      free(*(void **)(piVar4 + 4));
      *(undefined8 *)((long)I->content + 0x10) = 0;
    }
    if (*(long *)((long)I->content + 8) != 0) {
      piVar4 = (int *)I->content;
      if (0 < *piVar4) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          if (*(long *)(*(long *)(piVar4 + 2) + lVar6) != 0) {
            arkFreeVec((ARKodeMem)arkode_mem,(N_Vector *)(*(long *)(piVar4 + 2) + lVar6));
            *(undefined8 *)(*(long *)((long)I->content + 8) + lVar6) = 0;
          }
          lVar5 = lVar5 + 1;
          piVar4 = (int *)I->content;
          lVar6 = lVar6 + 8;
        } while (lVar5 < *piVar4);
      }
      free(*(void **)(piVar4 + 2));
      *(undefined8 *)((long)I->content + 8) = 0;
    }
  }
  piVar4 = (int *)I->content;
  if (*(long *)(piVar4 + 4) == 0) {
    pvVar3 = malloc((long)*piVar4 << 3);
    *(void **)(piVar4 + 4) = pvVar3;
    if (pvVar3 != (void *)0x0) goto LAB_00409f68;
LAB_0040a06d:
    (*I->ops->free)(arkode_mem,I);
    iVar2 = -0x14;
  }
  else {
LAB_00409f68:
    if (*(long *)(piVar4 + 2) == 0) {
      pvVar3 = malloc((long)*piVar4 << 3);
      *(void **)(piVar4 + 2) = pvVar3;
      if (pvVar3 == (void *)0x0) goto LAB_0040a06d;
      piVar4 = (int *)I->content;
      if (0 < *piVar4) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          *(undefined8 *)(*(long *)(piVar4 + 2) + lVar6) = 0;
          iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x110),
                              (N_Vector *)(*(long *)((long)I->content + 8) + lVar6));
          if (iVar1 == 0) goto LAB_0040a06d;
          lVar5 = lVar5 + 1;
          piVar4 = (int *)I->content;
          lVar6 = lVar6 + 8;
        } while (lVar5 < *piVar4);
      }
    }
    piVar4 = (int *)I->content;
    if (piVar4[1] < *piVar4) {
      piVar4[1] = *piVar4;
    }
    iVar1 = piVar4[1];
    if (0 < (long)iVar1) {
      memset(*(void **)(piVar4 + 4),0,(long)iVar1 * 8);
    }
    iVar1 = N_VConstVectorArray(iVar1,0.0,*(N_Vector **)(piVar4 + 2));
    iVar2 = -0x1c;
    if (iVar1 == 0) {
      pvVar3 = I->content;
      **(realtype **)((long)pvVar3 + 0x10) = tnew;
      N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),
               (N_Vector)**(undefined8 **)((long)pvVar3 + 8));
      *(undefined4 *)((long)I->content + 0x18) = 1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int arkInterpInit_Lagrange(void* arkode_mem, ARKInterp I,
                           realtype tnew)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) {
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL) {
    LINT_THIST(I) = (realtype*) malloc(LINT_NMAX(I) * sizeof(realtype));
    if (LINT_THIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL) {
    LINT_YHIST(I) = (N_Vector*) malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
    for (i=0; i<LINT_NMAX(I); i++) {
      LINT_YJ(I,i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I,i)))) {
        arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necesary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
    LINT_NMAXALLOC(I) = LINT_NMAX(I);

  /* zero out history (to be safe) */
  for (i=0; i<LINT_NMAXALLOC(I); i++)
    LINT_TJ(I,i) = RCONST(0.0);
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), RCONST(0.0), LINT_YHIST(I)))
    return(ARK_VECTOROP_ERR);

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I,0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I,0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return(ARK_SUCCESS);
}